

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O3

void av1_dist_wtd_convolve_2d_copy_avx2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               ConvolveParams *conv_params)

{
  int iVar1;
  long lVar2;
  uint8_t *puVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  undefined1 (*pauVar7) [16];
  undefined1 (*pauVar8) [32];
  long lVar9;
  undefined1 auVar10 [32];
  undefined2 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar39 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar44 [32];
  undefined1 auVar43 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar24 [32];
  
  iVar5 = conv_params->round_1 + conv_params->round_0;
  pauVar8 = (undefined1 (*) [32])conv_params->dst;
  cVar4 = (char)iVar5;
  iVar1 = conv_params->dst_stride;
  lVar9 = (long)iVar1;
  uVar6 = 0xe - iVar5;
  auVar10._0_2_ = (undefined2)((1 << (0x15U - cVar4 & 0x1f)) + (1 << (0x16U - cVar4 & 0x1f)));
  auVar10._2_2_ = auVar10._0_2_;
  auVar10._4_2_ = auVar10._0_2_;
  auVar10._6_2_ = auVar10._0_2_;
  auVar10._8_2_ = auVar10._0_2_;
  auVar10._10_2_ = auVar10._0_2_;
  auVar10._12_2_ = auVar10._0_2_;
  auVar10._14_2_ = auVar10._0_2_;
  auVar10._16_2_ = auVar10._0_2_;
  auVar10._18_2_ = auVar10._0_2_;
  auVar10._20_2_ = auVar10._0_2_;
  auVar10._22_2_ = auVar10._0_2_;
  auVar10._24_2_ = auVar10._0_2_;
  auVar10._26_2_ = auVar10._0_2_;
  auVar10._28_2_ = auVar10._0_2_;
  auVar10._30_2_ = auVar10._0_2_;
  if (conv_params->do_average == 0) {
    if (w < 0x10) {
      lVar2 = (long)src_stride;
      do {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)((long)src + lVar2);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *(ulong *)src;
        auVar13._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar12;
        auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)((long)src + lVar2 * 3);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = *(ulong *)((long)src + lVar2 * 2);
        auVar15._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar16;
        auVar15._16_16_ = ZEXT116(1) * auVar20;
        auVar13 = vpunpcklbw_avx2(auVar13,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar15 = vpunpcklbw_avx2(auVar15,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar13 = vpsllw_avx2(auVar13,4);
        auVar15 = vpsllw_avx2(auVar15,4);
        auVar13 = vpaddw_avx2(auVar13,auVar10);
        auVar15 = vpaddw_avx2(auVar15,auVar10);
        *(undefined1 (*) [16])*pauVar8 = auVar13._0_16_;
        *(undefined1 (*) [16])(*pauVar8 + lVar9 * 2) = auVar13._16_16_;
        *(undefined1 (*) [16])(*pauVar8 + (long)(iVar1 * 2) * 2) = auVar15._0_16_;
        *(undefined1 (*) [16])(*pauVar8 + (long)(iVar1 * 3) * 2) = auVar15._16_16_;
        src = (uint8_t *)((long)src + (long)(src_stride << 2));
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 4) * 2);
        h = h + -4;
      } while (h != 0);
    }
    else {
      switch(w << 0x1c | w - 0x10U >> 4) {
      case 0:
        lVar2 = (long)src_stride;
        do {
          auVar13 = vpmovzxbw_avx2(*(undefined1 (*) [16])src);
          auVar15 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar2));
          auVar18 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar2 * 2));
          auVar23 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar2 * 3));
          auVar13 = vpsllw_avx2(auVar13,4);
          auVar15 = vpsllw_avx2(auVar15,4);
          auVar18 = vpsllw_avx2(auVar18,4);
          auVar23 = vpsllw_avx2(auVar23,4);
          auVar13 = vpaddw_avx2(auVar13,auVar10);
          auVar15 = vpaddw_avx2(auVar15,auVar10);
          auVar18 = vpaddw_avx2(auVar18,auVar10);
          auVar23 = vpaddw_avx2(auVar23,auVar10);
          *pauVar8 = auVar13;
          *(undefined1 (*) [32])(*pauVar8 + lVar9 * 2) = auVar15;
          *(undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 2) * 2) = auVar18;
          *(undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 3) * 2) = auVar23;
          src = *(undefined1 (*) [16])src + (src_stride << 2);
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 4) * 2);
          h = h + -4;
        } while (h != 0);
        break;
      case 1:
        do {
          auVar13 = vpmovzxbw_avx2(*(undefined1 (*) [16])src);
          auVar15 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + src_stride));
          auVar18 = vpmovzxbw_avx2(*(undefined1 (*) [16])((long)src + 0x10));
          auVar23 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                    (*(undefined1 (*) [16])((long)src + 0x10) + src_stride));
          auVar13 = vpsllw_avx2(auVar13,4);
          auVar15 = vpsllw_avx2(auVar15,4);
          auVar18 = vpsllw_avx2(auVar18,4);
          auVar23 = vpsllw_avx2(auVar23,4);
          auVar13 = vpaddw_avx2(auVar13,auVar10);
          auVar15 = vpaddw_avx2(auVar15,auVar10);
          auVar18 = vpaddw_avx2(auVar18,auVar10);
          auVar23 = vpaddw_avx2(auVar23,auVar10);
          *pauVar8 = auVar13;
          *(undefined1 (*) [32])(*pauVar8 + lVar9 * 2) = auVar15;
          pauVar8[1] = auVar18;
          *(undefined1 (*) [32])(*pauVar8 + (long)(iVar1 + 0x10) * 2) = auVar23;
          src = *(undefined1 (*) [16])src + src_stride * 2;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 2) * 2);
          h = h + -2;
        } while (h != 0);
        break;
      case 3:
        pauVar8 = pauVar8 + 3;
        pauVar7 = (undefined1 (*) [16])(src + 0x30);
        do {
          auVar13 = vpmovzxbw_avx2(pauVar7[-3]);
          auVar15 = vpmovzxbw_avx2(pauVar7[-2]);
          auVar18 = vpmovzxbw_avx2(pauVar7[-1]);
          auVar23 = vpmovzxbw_avx2(*pauVar7);
          auVar13 = vpsllw_avx2(auVar13,4);
          auVar15 = vpsllw_avx2(auVar15,4);
          auVar18 = vpsllw_avx2(auVar18,4);
          auVar23 = vpsllw_avx2(auVar23,4);
          auVar13 = vpaddw_avx2(auVar13,auVar10);
          auVar15 = vpaddw_avx2(auVar15,auVar10);
          auVar18 = vpaddw_avx2(auVar18,auVar10);
          auVar23 = vpaddw_avx2(auVar23,auVar10);
          pauVar8[-3] = auVar13;
          pauVar8[-2] = auVar15;
          pauVar8[-1] = auVar18;
          *pauVar8 = auVar23;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + lVar9 * 2);
          pauVar7 = (undefined1 (*) [16])(*pauVar7 + src_stride);
          h = h + -1;
        } while (h != 0);
        break;
      case 7:
        pauVar8 = pauVar8 + 7;
        pauVar7 = (undefined1 (*) [16])(src + 0x70);
        do {
          auVar13 = vpmovzxbw_avx2(pauVar7[-7]);
          auVar15 = vpmovzxbw_avx2(pauVar7[-6]);
          auVar18 = vpmovzxbw_avx2(pauVar7[-5]);
          auVar23 = vpmovzxbw_avx2(pauVar7[-4]);
          auVar13 = vpsllw_avx2(auVar13,4);
          auVar15 = vpsllw_avx2(auVar15,4);
          auVar18 = vpsllw_avx2(auVar18,4);
          auVar23 = vpsllw_avx2(auVar23,4);
          auVar13 = vpaddw_avx2(auVar13,auVar10);
          auVar15 = vpaddw_avx2(auVar15,auVar10);
          auVar18 = vpaddw_avx2(auVar18,auVar10);
          auVar23 = vpaddw_avx2(auVar23,auVar10);
          pauVar8[-7] = auVar13;
          pauVar8[-6] = auVar15;
          pauVar8[-5] = auVar18;
          pauVar8[-4] = auVar23;
          auVar13 = vpmovzxbw_avx2(pauVar7[-3]);
          auVar15 = vpmovzxbw_avx2(pauVar7[-2]);
          auVar18 = vpmovzxbw_avx2(pauVar7[-1]);
          auVar23 = vpmovzxbw_avx2(*pauVar7);
          auVar13 = vpsllw_avx2(auVar13,4);
          auVar15 = vpsllw_avx2(auVar15,4);
          auVar18 = vpsllw_avx2(auVar18,4);
          auVar23 = vpsllw_avx2(auVar23,4);
          auVar13 = vpaddw_avx2(auVar13,auVar10);
          auVar15 = vpaddw_avx2(auVar15,auVar10);
          auVar18 = vpaddw_avx2(auVar18,auVar10);
          auVar23 = vpaddw_avx2(auVar23,auVar10);
          pauVar8[-3] = auVar13;
          pauVar8[-2] = auVar15;
          pauVar8[-1] = auVar18;
          *pauVar8 = auVar23;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + lVar9 * 2);
          pauVar7 = (undefined1 (*) [16])(*pauVar7 + src_stride);
          h = h + -1;
        } while (h != 0);
      }
    }
  }
  else {
    uVar11 = (undefined2)((uint)(1 << ((byte)uVar6 & 0x1f)) >> 1);
    auVar18._2_2_ = uVar11;
    auVar18._0_2_ = uVar11;
    auVar18._4_2_ = uVar11;
    auVar18._6_2_ = uVar11;
    auVar18._8_2_ = uVar11;
    auVar18._10_2_ = uVar11;
    auVar18._12_2_ = uVar11;
    auVar18._14_2_ = uVar11;
    auVar18._16_2_ = uVar11;
    auVar18._18_2_ = uVar11;
    auVar18._20_2_ = uVar11;
    auVar18._22_2_ = uVar11;
    auVar18._24_2_ = uVar11;
    auVar18._26_2_ = uVar11;
    auVar18._28_2_ = uVar11;
    auVar18._30_2_ = uVar11;
    if (conv_params->use_dist_wtd_comp_avg == 0) {
      if (w < 0x10) {
        auVar13 = vpsubw_avx2(auVar18,auVar10);
        if (w == 8) {
          do {
            auVar21._8_8_ = 0;
            auVar21._0_8_ = *(ulong *)((long)src + (long)src_stride);
            auVar17._8_8_ = 0;
            auVar17._0_8_ = *(ulong *)src;
            auVar39._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar17;
            auVar39._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar21;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = *(ulong *)((long)src + (long)(src_stride * 3));
            auVar27._8_8_ = 0;
            auVar27._0_8_ = *(ulong *)((long)src + (long)(src_stride * 2));
            auVar41._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar27;
            auVar41._16_16_ = ZEXT116(1) * auVar35;
            auVar15 = vpunpcklbw_avx2(auVar39,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar18 = vpunpcklbw_avx2(auVar41,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar15 = vpsllw_avx2(auVar15,4);
            auVar47._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(*pauVar8 + lVar9 * 2) +
                 ZEXT116(1) * *(undefined1 (*) [16])*pauVar8;
            auVar47._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar8 + lVar9 * 2);
            auVar23 = vpsllw_avx2(auVar18,4);
            auVar44._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(*pauVar8 + (long)(iVar1 * 3) * 2) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar8 + (long)(iVar1 * 2) * 2);
            auVar44._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar8 + (long)(iVar1 * 3) * 2);
            auVar15 = vpaddw_avx2(auVar10,auVar15);
            auVar15 = vpaddw_avx2(auVar15,auVar47);
            auVar18 = vpsraw_avx2(auVar15,1);
            auVar15 = vpaddw_avx2(auVar10,auVar23);
            auVar15 = vpaddw_avx2(auVar15,auVar44);
            auVar18 = vpaddw_avx2(auVar13,auVar18);
            auVar18 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
            auVar15 = vpsraw_avx2(auVar15,1);
            auVar15 = vpaddw_avx2(auVar13,auVar15);
            auVar15 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
            auVar15 = vpackuswb_avx2(auVar18,auVar15);
            *(long *)dst0 = auVar15._0_8_;
            *(long *)(dst0 + dst_stride0) = auVar15._16_8_;
            auVar12 = vpshufd_avx(auVar15._0_16_,0x4e);
            *(long *)(dst0 + dst_stride0 * 2) = auVar12._0_8_;
            auVar12 = vpshufd_avx(auVar15._16_16_,0x4e);
            *(long *)(dst0 + dst_stride0 * 3) = auVar12._0_8_;
            src = (uint8_t *)((long)src + (long)(src_stride * 4));
            dst0 = dst0 + dst_stride0 * 4;
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + (long)(iVar1 << 2) * 2);
            h = h + -4;
          } while (h != 0);
        }
        else {
          do {
            auVar12 = vpinsrd_avx(ZEXT416(*(uint *)src),
                                  *(undefined4 *)((long)src + (long)src_stride),1);
            auVar14 = vpinsrd_avx(ZEXT416(*(uint *)((long)src + (long)(src_stride * 2))),
                                  *(undefined4 *)((long)src + (long)(src_stride * 3)),1);
            auVar23._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar12;
            auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
            auVar15 = vpunpcklbw_avx2(auVar23,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar18 = vpsllw_avx2(auVar15,4);
            auVar22._8_8_ = 0;
            auVar22._0_8_ = *(ulong *)(*pauVar8 + (long)(iVar1 * 3) * 2);
            auVar29._8_8_ = 0;
            auVar29._0_8_ = *(ulong *)(*pauVar8 + (long)(iVar1 * 2) * 2);
            auVar12 = vpunpcklqdq_avx(auVar29,auVar22);
            auVar30._8_8_ = 0;
            auVar30._0_8_ = *(ulong *)(*pauVar8 + lVar9 * 2);
            auVar38._8_8_ = 0;
            auVar38._0_8_ = *(ulong *)*pauVar8;
            auVar14 = vpunpcklqdq_avx(auVar38,auVar30);
            auVar31._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar14;
            auVar31._16_16_ = ZEXT116(1) * auVar12;
            auVar15 = vpaddw_avx2(auVar10,auVar31);
            auVar15 = vpaddw_avx2(auVar18,auVar15);
            auVar15 = vpsraw_avx2(auVar15,1);
            auVar15 = vpaddw_avx2(auVar13,auVar15);
            auVar15 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
            auVar15 = vpackuswb_avx2(auVar15,auVar15);
            *(int *)dst0 = auVar15._0_4_;
            *(int *)(dst0 + dst_stride0 * 2) = auVar15._16_4_;
            *(int *)(dst0 + dst_stride0) = auVar15._4_4_;
            *(int *)(dst0 + dst_stride0 * 3) = auVar15._20_4_;
            src = (uint8_t *)((long)src + (long)(src_stride * 4));
            dst0 = dst0 + dst_stride0 * 4;
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + (long)(iVar1 << 2) * 2);
            h = h + -4;
          } while (h != 0);
        }
      }
      else if (w == 0x80) {
        auVar13 = vpsubw_avx2(auVar18,auVar10);
        pauVar8 = pauVar8 + 7;
        puVar3 = dst0 + 0x70;
        pauVar7 = (undefined1 (*) [16])(src + 0x70);
        do {
          auVar15 = vpmovzxbw_avx2(pauVar7[-7]);
          auVar18 = vpmovzxbw_avx2(pauVar7[-6]);
          auVar23 = vpmovzxbw_avx2(pauVar7[-5]);
          auVar31 = vpmovzxbw_avx2(pauVar7[-4]);
          auVar15 = vpsllw_avx2(auVar15,4);
          auVar18 = vpsllw_avx2(auVar18,4);
          auVar23 = vpsllw_avx2(auVar23,4);
          auVar31 = vpsllw_avx2(auVar31,4);
          auVar15 = vpaddw_avx2(auVar15,auVar10);
          auVar18 = vpaddw_avx2(auVar18,auVar10);
          auVar23 = vpaddw_avx2(auVar23,auVar10);
          auVar31 = vpaddw_avx2(auVar31,auVar10);
          auVar15 = vpaddw_avx2(auVar15,pauVar8[-7]);
          auVar18 = vpaddw_avx2(auVar18,pauVar8[-6]);
          auVar23 = vpaddw_avx2(auVar23,pauVar8[-5]);
          auVar31 = vpaddw_avx2(auVar31,pauVar8[-4]);
          auVar15 = vpsraw_avx2(auVar15,1);
          auVar15 = vpaddw_avx2(auVar13,auVar15);
          auVar39 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
          auVar15 = vpsraw_avx2(auVar18,1);
          auVar15 = vpaddw_avx2(auVar13,auVar15);
          auVar18 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
          auVar15 = vpsraw_avx2(auVar23,1);
          auVar15 = vpaddw_avx2(auVar13,auVar15);
          auVar12 = ZEXT416(uVar6);
          auVar23 = vpsraw_avx2(auVar15,auVar12);
          auVar15 = vpsraw_avx2(auVar31,1);
          auVar15 = vpaddw_avx2(auVar13,auVar15);
          auVar31 = vpsraw_avx2(auVar15,auVar12);
          auVar15 = vpackuswb_avx2(auVar39,auVar18);
          auVar18 = vpackuswb_avx2(auVar23,auVar31);
          auVar15 = vpermq_avx2(auVar15,0xd8);
          auVar18 = vpermq_avx2(auVar18,0xd8);
          *(undefined1 (*) [32])(puVar3 + -0x70) = auVar15;
          *(undefined1 (*) [32])(puVar3 + -0x50) = auVar18;
          auVar15 = vpmovzxbw_avx2(pauVar7[-3]);
          auVar18 = vpmovzxbw_avx2(pauVar7[-2]);
          auVar23 = vpmovzxbw_avx2(pauVar7[-1]);
          auVar31 = vpmovzxbw_avx2(*pauVar7);
          auVar15 = vpsllw_avx2(auVar15,4);
          auVar18 = vpsllw_avx2(auVar18,4);
          auVar23 = vpsllw_avx2(auVar23,4);
          auVar31 = vpsllw_avx2(auVar31,4);
          auVar15 = vpaddw_avx2(auVar15,auVar10);
          auVar18 = vpaddw_avx2(auVar18,auVar10);
          auVar23 = vpaddw_avx2(auVar23,auVar10);
          auVar31 = vpaddw_avx2(auVar31,auVar10);
          auVar15 = vpaddw_avx2(auVar15,pauVar8[-3]);
          auVar18 = vpaddw_avx2(auVar18,pauVar8[-2]);
          auVar23 = vpaddw_avx2(auVar23,pauVar8[-1]);
          auVar39 = vpsraw_avx2(auVar15,1);
          auVar15 = vpaddw_avx2(auVar31,*pauVar8);
          auVar31 = vpsraw_avx2(auVar18,1);
          auVar41 = vpsraw_avx2(auVar23,1);
          auVar18 = vpaddw_avx2(auVar13,auVar39);
          auVar18 = vpsraw_avx2(auVar18,auVar12);
          auVar39 = vpsraw_avx2(auVar15,1);
          auVar15 = vpaddw_avx2(auVar13,auVar31);
          auVar23 = vpsraw_avx2(auVar15,auVar12);
          auVar15 = vpaddw_avx2(auVar13,auVar41);
          auVar31 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
          auVar15 = vpackuswb_avx2(auVar18,auVar23);
          auVar18 = vpaddw_avx2(auVar13,auVar39);
          auVar18 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
          auVar18 = vpackuswb_avx2(auVar31,auVar18);
          auVar15 = vpermq_avx2(auVar15,0xd8);
          auVar18 = vpermq_avx2(auVar18,0xd8);
          *(undefined1 (*) [32])(puVar3 + -0x30) = auVar15;
          *(undefined1 (*) [32])(puVar3 + -0x10) = auVar18;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + lVar9 * 2);
          puVar3 = puVar3 + dst_stride0;
          pauVar7 = (undefined1 (*) [16])(*pauVar7 + src_stride);
          h = h + -1;
        } while (h != 0);
      }
      else if (w == 0x40) {
        auVar13 = vpsubw_avx2(auVar18,auVar10);
        pauVar8 = pauVar8 + 3;
        puVar3 = dst0 + 0x30;
        pauVar7 = (undefined1 (*) [16])(src + 0x30);
        do {
          auVar15 = vpmovzxbw_avx2(pauVar7[-3]);
          auVar18 = vpmovzxbw_avx2(pauVar7[-2]);
          auVar23 = vpmovzxbw_avx2(pauVar7[-1]);
          auVar31 = vpmovzxbw_avx2(*pauVar7);
          auVar15 = vpsllw_avx2(auVar15,4);
          auVar18 = vpsllw_avx2(auVar18,4);
          auVar23 = vpsllw_avx2(auVar23,4);
          auVar31 = vpsllw_avx2(auVar31,4);
          auVar15 = vpaddw_avx2(auVar15,auVar10);
          auVar18 = vpaddw_avx2(auVar18,auVar10);
          auVar23 = vpaddw_avx2(auVar23,auVar10);
          auVar31 = vpaddw_avx2(auVar31,auVar10);
          auVar15 = vpaddw_avx2(auVar15,pauVar8[-3]);
          auVar39 = vpsraw_avx2(auVar15,1);
          auVar15 = vpaddw_avx2(auVar18,pauVar8[-2]);
          auVar41 = vpsraw_avx2(auVar15,1);
          auVar15 = vpaddw_avx2(auVar23,pauVar8[-1]);
          auVar18 = vpaddw_avx2(auVar31,*pauVar8);
          auVar31 = vpsraw_avx2(auVar15,1);
          auVar15 = vpaddw_avx2(auVar13,auVar39);
          auVar23 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
          auVar39 = vpsraw_avx2(auVar18,1);
          auVar15 = vpaddw_avx2(auVar13,auVar41);
          auVar15 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
          auVar15 = vpackuswb_avx2(auVar23,auVar15);
          auVar18 = vpaddw_avx2(auVar13,auVar31);
          auVar23 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
          auVar18 = vpaddw_avx2(auVar13,auVar39);
          auVar18 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
          auVar18 = vpackuswb_avx2(auVar23,auVar18);
          auVar15 = vpermq_avx2(auVar15,0xd8);
          auVar18 = vpermq_avx2(auVar18,0xd8);
          *(undefined1 (*) [32])(puVar3 + -0x30) = auVar15;
          *(undefined1 (*) [32])(puVar3 + -0x10) = auVar18;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + lVar9 * 2);
          puVar3 = puVar3 + dst_stride0;
          pauVar7 = (undefined1 (*) [16])(*pauVar7 + src_stride);
          h = h + -1;
        } while (h != 0);
      }
      else {
        lVar2 = (long)src_stride;
        if (w == 0x20) {
          auVar13 = vpsubw_avx2(auVar18,auVar10);
          do {
            auVar15 = vpmovzxbw_avx2(*(undefined1 (*) [16])src);
            auVar18 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar2));
            auVar23 = vpmovzxbw_avx2(*(undefined1 (*) [16])((long)src + 0x10));
            auVar31 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                      (*(undefined1 (*) [16])((long)src + 0x10) + lVar2));
            auVar15 = vpsllw_avx2(auVar15,4);
            auVar18 = vpsllw_avx2(auVar18,4);
            auVar23 = vpsllw_avx2(auVar23,4);
            auVar31 = vpsllw_avx2(auVar31,4);
            auVar15 = vpaddw_avx2(auVar15,auVar10);
            auVar18 = vpaddw_avx2(auVar18,auVar10);
            auVar23 = vpaddw_avx2(auVar23,auVar10);
            auVar31 = vpaddw_avx2(auVar31,auVar10);
            auVar15 = vpaddw_avx2(auVar15,*pauVar8);
            auVar18 = vpaddw_avx2(auVar18,*(undefined1 (*) [32])(*pauVar8 + lVar9 * 2));
            auVar23 = vpaddw_avx2(auVar23,pauVar8[1]);
            auVar31 = vpaddw_avx2(auVar31,*(undefined1 (*) [32])
                                           (*pauVar8 + (long)(iVar1 + 0x10) * 2));
            auVar15 = vpsraw_avx2(auVar15,1);
            auVar15 = vpaddw_avx2(auVar13,auVar15);
            auVar39 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
            auVar15 = vpsraw_avx2(auVar18,1);
            auVar15 = vpaddw_avx2(auVar13,auVar15);
            auVar18 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
            auVar15 = vpsraw_avx2(auVar23,1);
            auVar15 = vpaddw_avx2(auVar13,auVar15);
            auVar23 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
            auVar15 = vpsraw_avx2(auVar31,1);
            auVar15 = vpaddw_avx2(auVar13,auVar15);
            auVar31 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
            auVar15 = vpackuswb_avx2(auVar39,auVar18);
            auVar18 = vpackuswb_avx2(auVar23,auVar31);
            auVar15 = vpermq_avx2(auVar15,0xd8);
            auVar18 = vpermq_avx2(auVar18,0xd8);
            *(undefined1 (*) [16])dst0 = auVar15._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst0 + dst_stride0) = auVar15._16_16_;
            *(undefined1 (*) [16])((long)dst0 + 0x10) = auVar18._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst0 + (dst_stride0 + 0x10)) =
                 auVar18._16_16_;
            src = *(undefined1 (*) [16])src + src_stride * 2;
            dst0 = *(undefined1 (*) [16])dst0 + dst_stride0 * 2;
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 2) * 2);
            h = h + -2;
          } while (h != 0);
        }
        else {
          auVar13 = vpsubw_avx2(auVar18,auVar10);
          do {
            auVar15 = vpmovzxbw_avx2(*(undefined1 (*) [16])src);
            auVar18 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar2));
            auVar23 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar2 * 2));
            auVar31 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                      (*(undefined1 (*) [16])src + src_stride * 3));
            auVar15 = vpsllw_avx2(auVar15,4);
            auVar18 = vpsllw_avx2(auVar18,4);
            auVar23 = vpsllw_avx2(auVar23,4);
            auVar31 = vpsllw_avx2(auVar31,4);
            auVar15 = vpaddw_avx2(auVar15,auVar10);
            auVar18 = vpaddw_avx2(auVar18,auVar10);
            auVar23 = vpaddw_avx2(auVar23,auVar10);
            auVar31 = vpaddw_avx2(auVar31,auVar10);
            auVar15 = vpaddw_avx2(auVar15,*pauVar8);
            auVar18 = vpaddw_avx2(auVar18,*(undefined1 (*) [32])(*pauVar8 + lVar9 * 2));
            auVar23 = vpaddw_avx2(auVar23,*(undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 2) * 2));
            auVar31 = vpaddw_avx2(auVar31,*(undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 3) * 2));
            auVar15 = vpsraw_avx2(auVar15,1);
            auVar15 = vpaddw_avx2(auVar13,auVar15);
            auVar39 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
            auVar15 = vpsraw_avx2(auVar18,1);
            auVar15 = vpaddw_avx2(auVar13,auVar15);
            auVar18 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
            auVar15 = vpsraw_avx2(auVar23,1);
            auVar15 = vpaddw_avx2(auVar13,auVar15);
            auVar23 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
            auVar15 = vpsraw_avx2(auVar31,1);
            auVar15 = vpaddw_avx2(auVar13,auVar15);
            auVar31 = vpsraw_avx2(auVar15,ZEXT416(uVar6));
            auVar15 = vpackuswb_avx2(auVar39,auVar18);
            auVar18 = vpackuswb_avx2(auVar23,auVar31);
            auVar15 = vpermq_avx2(auVar15,0xd8);
            auVar18 = vpermq_avx2(auVar18,0xd8);
            *(undefined1 (*) [16])dst0 = auVar15._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst0 + dst_stride0) = auVar15._16_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst0 + dst_stride0 * 2) = auVar18._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst0 + dst_stride0 * 3) = auVar18._16_16_;
            src = *(undefined1 (*) [16])src + (src_stride << 2);
            dst0 = *(undefined1 (*) [16])dst0 + (dst_stride0 << 2);
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 4) * 2);
            h = h + -4;
          } while (h != 0);
        }
      }
    }
    else {
      uVar11 = (undefined2)conv_params->fwd_offset;
      auVar46._2_2_ = uVar11;
      auVar46._0_2_ = uVar11;
      auVar46._4_2_ = uVar11;
      auVar46._6_2_ = uVar11;
      auVar46._8_2_ = uVar11;
      auVar46._10_2_ = uVar11;
      auVar46._12_2_ = uVar11;
      auVar46._14_2_ = uVar11;
      auVar46._16_2_ = uVar11;
      auVar46._18_2_ = uVar11;
      auVar46._20_2_ = uVar11;
      auVar46._22_2_ = uVar11;
      auVar46._24_2_ = uVar11;
      auVar46._26_2_ = uVar11;
      auVar46._28_2_ = uVar11;
      auVar46._30_2_ = uVar11;
      uVar11 = (undefined2)conv_params->bck_offset;
      auVar48._2_2_ = uVar11;
      auVar48._0_2_ = uVar11;
      auVar48._4_2_ = uVar11;
      auVar48._6_2_ = uVar11;
      auVar48._8_2_ = uVar11;
      auVar48._10_2_ = uVar11;
      auVar48._12_2_ = uVar11;
      auVar48._14_2_ = uVar11;
      auVar48._16_2_ = uVar11;
      auVar48._18_2_ = uVar11;
      auVar48._20_2_ = uVar11;
      auVar48._22_2_ = uVar11;
      auVar48._24_2_ = uVar11;
      auVar48._26_2_ = uVar11;
      auVar48._28_2_ = uVar11;
      auVar48._30_2_ = uVar11;
      auVar13 = vpunpcklwd_avx2(auVar46,auVar48);
      if (w < 0x10) {
        auVar15 = vpsubw_avx2(auVar18,auVar10);
        if (w == 8) {
          do {
            auVar26._8_8_ = 0;
            auVar26._0_8_ = *(ulong *)((long)src + (long)src_stride);
            auVar19._8_8_ = 0;
            auVar19._0_8_ = *(ulong *)src;
            auVar24._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar19;
            auVar24._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = *(ulong *)((long)src + (long)(src_stride * 3));
            auVar34._8_8_ = 0;
            auVar34._0_8_ = *(ulong *)((long)src + (long)(src_stride * 2));
            auVar32._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar34;
            auVar32._16_16_ = ZEXT116(1) * auVar42;
            auVar18 = vpunpcklbw_avx2(auVar24,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar23 = vpunpcklbw_avx2(auVar32,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar18 = vpsllw_avx2(auVar18,4);
            auVar23 = vpsllw_avx2(auVar23,4);
            auVar18 = vpaddw_avx2(auVar18,auVar10);
            auVar40._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(*pauVar8 + lVar9 * 2) +
                 ZEXT116(1) * *(undefined1 (*) [16])*pauVar8;
            auVar40._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar8 + lVar9 * 2);
            auVar23 = vpaddw_avx2(auVar23,auVar10);
            auVar45._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(*pauVar8 + (long)(iVar1 * 3) * 2) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar8 + (long)(iVar1 * 2) * 2);
            auVar45._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar8 + (long)(iVar1 * 3) * 2);
            auVar39 = vpunpcklwd_avx2(auVar40,auVar18);
            auVar31 = vpunpckhwd_avx2(auVar40,auVar18);
            auVar18 = vpmaddwd_avx2(auVar39,auVar13);
            auVar31 = vpmaddwd_avx2(auVar31,auVar13);
            auVar39 = vpsrad_avx2(auVar18,4);
            auVar18 = vpsrad_avx2(auVar31,4);
            auVar18 = vpackssdw_avx2(auVar39,auVar18);
            auVar39 = vpunpcklwd_avx2(auVar45,auVar23);
            auVar31 = vpunpckhwd_avx2(auVar45,auVar23);
            auVar23 = vpmaddwd_avx2(auVar39,auVar13);
            auVar31 = vpmaddwd_avx2(auVar31,auVar13);
            auVar39 = vpsrad_avx2(auVar23,4);
            auVar31 = vpsrad_avx2(auVar31,4);
            auVar18 = vpaddw_avx2(auVar15,auVar18);
            auVar23 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
            auVar18 = vpackssdw_avx2(auVar39,auVar31);
            auVar18 = vpaddw_avx2(auVar15,auVar18);
            auVar18 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
            auVar18 = vpackuswb_avx2(auVar23,auVar18);
            *(long *)dst0 = auVar18._0_8_;
            *(long *)(dst0 + dst_stride0) = auVar18._16_8_;
            auVar12 = vpshufd_avx(auVar18._0_16_,0x4e);
            *(long *)(dst0 + dst_stride0 * 2) = auVar12._0_8_;
            auVar12 = vpshufd_avx(auVar18._16_16_,0x4e);
            *(long *)(dst0 + dst_stride0 * 3) = auVar12._0_8_;
            src = (uint8_t *)((long)src + (long)(src_stride * 4));
            dst0 = dst0 + dst_stride0 * 4;
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 4) * 2);
            h = h + -4;
          } while (h != 0);
        }
        else {
          do {
            auVar12 = vpinsrd_avx(ZEXT416(*(uint *)src),
                                  *(undefined4 *)((long)src + (long)src_stride),1);
            auVar14 = vpinsrd_avx(ZEXT416(*(uint *)((long)src + (long)(src_stride * 2))),
                                  *(undefined4 *)((long)src + (long)(src_stride * 3)),1);
            auVar25._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar12;
            auVar25._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
            auVar18 = vpunpcklbw_avx2(auVar25,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar18 = vpsllw_avx2(auVar18,4);
            auVar18 = vpaddw_avx2(auVar18,auVar10);
            auVar28._8_8_ = 0;
            auVar28._0_8_ = *(ulong *)(*pauVar8 + (long)(iVar1 * 3) * 2);
            auVar36._8_8_ = 0;
            auVar36._0_8_ = *(ulong *)(*pauVar8 + (long)(iVar1 * 2) * 2);
            auVar12 = vpunpcklqdq_avx(auVar36,auVar28);
            auVar37._8_8_ = 0;
            auVar37._0_8_ = *(ulong *)(*pauVar8 + lVar9 * 2);
            auVar43._8_8_ = 0;
            auVar43._0_8_ = *(ulong *)*pauVar8;
            auVar14 = vpunpcklqdq_avx(auVar43,auVar37);
            auVar33._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar14;
            auVar33._16_16_ = ZEXT116(1) * auVar12;
            auVar31 = vpunpcklwd_avx2(auVar33,auVar18);
            auVar23 = vpunpckhwd_avx2(auVar33,auVar18);
            auVar18 = vpmaddwd_avx2(auVar31,auVar13);
            auVar23 = vpmaddwd_avx2(auVar23,auVar13);
            auVar31 = vpsrad_avx2(auVar18,4);
            auVar18 = vpsrad_avx2(auVar23,4);
            auVar18 = vpackssdw_avx2(auVar31,auVar18);
            auVar18 = vpaddw_avx2(auVar15,auVar18);
            auVar18 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
            auVar18 = vpackuswb_avx2(auVar18,auVar18);
            *(int *)dst0 = auVar18._0_4_;
            *(int *)(dst0 + dst_stride0 * 2) = auVar18._16_4_;
            *(int *)(dst0 + dst_stride0) = auVar18._4_4_;
            *(int *)(dst0 + dst_stride0 * 3) = auVar18._20_4_;
            src = (uint8_t *)((long)src + (long)(src_stride * 4));
            dst0 = dst0 + dst_stride0 * 4;
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 4) * 2);
            h = h + -4;
          } while (h != 0);
        }
      }
      else if (w == 0x80) {
        auVar15 = vpsubw_avx2(auVar18,auVar10);
        pauVar8 = pauVar8 + 7;
        puVar3 = dst0 + 0x70;
        pauVar7 = (undefined1 (*) [16])(src + 0x70);
        do {
          auVar18 = vpmovzxbw_avx2(pauVar7[-7]);
          auVar23 = vpmovzxbw_avx2(pauVar7[-6]);
          auVar31 = vpmovzxbw_avx2(pauVar7[-5]);
          auVar39 = vpmovzxbw_avx2(pauVar7[-4]);
          auVar18 = vpsllw_avx2(auVar18,4);
          auVar23 = vpsllw_avx2(auVar23,4);
          auVar31 = vpsllw_avx2(auVar31,4);
          auVar39 = vpsllw_avx2(auVar39,4);
          auVar18 = vpaddw_avx2(auVar18,auVar10);
          auVar23 = vpaddw_avx2(auVar23,auVar10);
          auVar31 = vpaddw_avx2(auVar31,auVar10);
          auVar39 = vpaddw_avx2(auVar39,auVar10);
          auVar47 = vpunpcklwd_avx2(pauVar8[-7],auVar18);
          auVar41 = vpunpckhwd_avx2(pauVar8[-7],auVar18);
          auVar18 = vpmaddwd_avx2(auVar47,auVar13);
          auVar41 = vpmaddwd_avx2(auVar41,auVar13);
          auVar44 = vpsrad_avx2(auVar18,4);
          auVar18 = vpunpcklwd_avx2(pauVar8[-6],auVar23);
          auVar23 = vpunpckhwd_avx2(pauVar8[-6],auVar23);
          auVar41 = vpsrad_avx2(auVar41,4);
          auVar18 = vpmaddwd_avx2(auVar18,auVar13);
          auVar23 = vpmaddwd_avx2(auVar23,auVar13);
          auVar48 = vpsrad_avx2(auVar18,4);
          auVar47 = vpsrad_avx2(auVar23,4);
          auVar18 = vpunpcklwd_avx2(pauVar8[-5],auVar31);
          auVar31 = vpunpckhwd_avx2(pauVar8[-5],auVar31);
          auVar23 = vpmaddwd_avx2(auVar18,auVar13);
          auVar18 = vpackssdw_avx2(auVar44,auVar41);
          auVar31 = vpmaddwd_avx2(auVar31,auVar13);
          auVar46 = vpsrad_avx2(auVar23,4);
          auVar44 = vpsrad_avx2(auVar31,4);
          auVar23 = vpackssdw_avx2(auVar48,auVar47);
          auVar31 = vpunpcklwd_avx2(pauVar8[-4],auVar39);
          auVar41 = vpunpckhwd_avx2(pauVar8[-4],auVar39);
          auVar39 = vpmaddwd_avx2(auVar31,auVar13);
          auVar31 = vpackssdw_avx2(auVar46,auVar44);
          auVar41 = vpmaddwd_avx2(auVar41,auVar13);
          auVar18 = vpaddw_avx2(auVar15,auVar18);
          auVar47 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
          auVar44 = vpsrad_avx2(auVar39,4);
          auVar18 = vpaddw_avx2(auVar15,auVar23);
          auVar23 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
          auVar39 = vpsrad_avx2(auVar41,4);
          auVar18 = vpaddw_avx2(auVar15,auVar31);
          auVar12 = ZEXT416(uVar6);
          auVar31 = vpsraw_avx2(auVar18,auVar12);
          auVar18 = vpackssdw_avx2(auVar44,auVar39);
          auVar18 = vpaddw_avx2(auVar15,auVar18);
          auVar39 = vpsraw_avx2(auVar18,auVar12);
          auVar18 = vpackuswb_avx2(auVar47,auVar23);
          auVar23 = vpackuswb_avx2(auVar31,auVar39);
          auVar18 = vpermq_avx2(auVar18,0xd8);
          auVar23 = vpermq_avx2(auVar23,0xd8);
          *(undefined1 (*) [32])(puVar3 + -0x70) = auVar18;
          *(undefined1 (*) [32])(puVar3 + -0x50) = auVar23;
          auVar18 = vpmovzxbw_avx2(pauVar7[-3]);
          auVar23 = vpmovzxbw_avx2(pauVar7[-2]);
          auVar31 = vpmovzxbw_avx2(pauVar7[-1]);
          auVar39 = vpmovzxbw_avx2(*pauVar7);
          auVar18 = vpsllw_avx2(auVar18,4);
          auVar23 = vpsllw_avx2(auVar23,4);
          auVar31 = vpsllw_avx2(auVar31,4);
          auVar39 = vpsllw_avx2(auVar39,4);
          auVar18 = vpaddw_avx2(auVar18,auVar10);
          auVar23 = vpaddw_avx2(auVar23,auVar10);
          auVar31 = vpaddw_avx2(auVar31,auVar10);
          auVar39 = vpaddw_avx2(auVar39,auVar10);
          auVar47 = vpunpcklwd_avx2(pauVar8[-3],auVar18);
          auVar41 = vpunpckhwd_avx2(pauVar8[-3],auVar18);
          auVar18 = vpmaddwd_avx2(auVar47,auVar13);
          auVar41 = vpmaddwd_avx2(auVar41,auVar13);
          auVar47 = vpunpcklwd_avx2(pauVar8[-2],auVar23);
          auVar44 = vpsrad_avx2(auVar18,4);
          auVar23 = vpunpckhwd_avx2(pauVar8[-2],auVar23);
          auVar18 = vpmaddwd_avx2(auVar47,auVar13);
          auVar23 = vpmaddwd_avx2(auVar23,auVar13);
          auVar41 = vpsrad_avx2(auVar41,4);
          auVar46 = vpsrad_avx2(auVar18,4);
          auVar18 = vpunpcklwd_avx2(pauVar8[-1],auVar31);
          auVar31 = vpunpckhwd_avx2(pauVar8[-1],auVar31);
          auVar47 = vpsrad_avx2(auVar23,4);
          auVar18 = vpmaddwd_avx2(auVar18,auVar13);
          auVar23 = vpmaddwd_avx2(auVar31,auVar13);
          auVar48 = vpsrad_avx2(auVar18,4);
          auVar18 = vpackssdw_avx2(auVar44,auVar41);
          auVar41 = vpsrad_avx2(auVar23,4);
          auVar31 = vpunpcklwd_avx2(*pauVar8,auVar39);
          auVar39 = vpunpckhwd_avx2(*pauVar8,auVar39);
          auVar23 = vpackssdw_avx2(auVar46,auVar47);
          auVar31 = vpmaddwd_avx2(auVar31,auVar13);
          auVar39 = vpmaddwd_avx2(auVar39,auVar13);
          auVar47 = vpsrad_avx2(auVar31,4);
          auVar31 = vpackssdw_avx2(auVar48,auVar41);
          auVar41 = vpsrad_avx2(auVar39,4);
          auVar18 = vpaddw_avx2(auVar15,auVar18);
          auVar39 = vpsraw_avx2(auVar18,auVar12);
          auVar18 = vpackssdw_avx2(auVar47,auVar41);
          auVar23 = vpaddw_avx2(auVar15,auVar23);
          auVar41 = vpsraw_avx2(auVar23,auVar12);
          auVar23 = vpaddw_avx2(auVar15,auVar31);
          auVar31 = vpsraw_avx2(auVar23,ZEXT416(uVar6));
          auVar23 = vpackuswb_avx2(auVar39,auVar41);
          auVar18 = vpaddw_avx2(auVar15,auVar18);
          auVar18 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
          auVar18 = vpackuswb_avx2(auVar31,auVar18);
          auVar23 = vpermq_avx2(auVar23,0xd8);
          auVar18 = vpermq_avx2(auVar18,0xd8);
          *(undefined1 (*) [32])(puVar3 + -0x30) = auVar23;
          *(undefined1 (*) [32])(puVar3 + -0x10) = auVar18;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + lVar9 * 2);
          puVar3 = puVar3 + dst_stride0;
          pauVar7 = (undefined1 (*) [16])(*pauVar7 + src_stride);
          h = h + -1;
        } while (h != 0);
      }
      else if (w == 0x40) {
        auVar15 = vpsubw_avx2(auVar18,auVar10);
        pauVar8 = pauVar8 + 3;
        puVar3 = dst0 + 0x30;
        pauVar7 = (undefined1 (*) [16])(src + 0x30);
        do {
          auVar18 = vpmovzxbw_avx2(pauVar7[-3]);
          auVar23 = vpmovzxbw_avx2(pauVar7[-2]);
          auVar31 = vpmovzxbw_avx2(pauVar7[-1]);
          auVar39 = vpmovzxbw_avx2(*pauVar7);
          auVar18 = vpsllw_avx2(auVar18,4);
          auVar23 = vpsllw_avx2(auVar23,4);
          auVar31 = vpsllw_avx2(auVar31,4);
          auVar39 = vpsllw_avx2(auVar39,4);
          auVar18 = vpaddw_avx2(auVar18,auVar10);
          auVar23 = vpaddw_avx2(auVar23,auVar10);
          auVar31 = vpaddw_avx2(auVar31,auVar10);
          auVar39 = vpaddw_avx2(auVar39,auVar10);
          auVar47 = vpunpcklwd_avx2(pauVar8[-3],auVar18);
          auVar41 = vpunpckhwd_avx2(pauVar8[-3],auVar18);
          auVar18 = vpmaddwd_avx2(auVar47,auVar13);
          auVar41 = vpmaddwd_avx2(auVar41,auVar13);
          auVar47 = vpsrad_avx2(auVar18,4);
          auVar18 = vpsrad_avx2(auVar41,4);
          auVar18 = vpackssdw_avx2(auVar47,auVar18);
          auVar47 = vpunpcklwd_avx2(pauVar8[-2],auVar23);
          auVar41 = vpunpckhwd_avx2(pauVar8[-2],auVar23);
          auVar23 = vpmaddwd_avx2(auVar47,auVar13);
          auVar41 = vpmaddwd_avx2(auVar41,auVar13);
          auVar47 = vpsrad_avx2(auVar23,4);
          auVar23 = vpsrad_avx2(auVar41,4);
          auVar23 = vpackssdw_avx2(auVar47,auVar23);
          auVar47 = vpunpcklwd_avx2(pauVar8[-1],auVar31);
          auVar41 = vpunpckhwd_avx2(pauVar8[-1],auVar31);
          auVar31 = vpmaddwd_avx2(auVar47,auVar13);
          auVar41 = vpmaddwd_avx2(auVar41,auVar13);
          auVar47 = vpsrad_avx2(auVar31,4);
          auVar31 = vpsrad_avx2(auVar41,4);
          auVar31 = vpackssdw_avx2(auVar47,auVar31);
          auVar47 = vpunpcklwd_avx2(*pauVar8,auVar39);
          auVar41 = vpunpckhwd_avx2(*pauVar8,auVar39);
          auVar39 = vpmaddwd_avx2(auVar47,auVar13);
          auVar41 = vpmaddwd_avx2(auVar41,auVar13);
          auVar47 = vpsrad_avx2(auVar39,4);
          auVar41 = vpsrad_avx2(auVar41,4);
          auVar18 = vpaddw_avx2(auVar15,auVar18);
          auVar39 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
          auVar18 = vpackssdw_avx2(auVar47,auVar41);
          auVar23 = vpaddw_avx2(auVar15,auVar23);
          auVar23 = vpsraw_avx2(auVar23,ZEXT416(uVar6));
          auVar23 = vpackuswb_avx2(auVar39,auVar23);
          auVar31 = vpaddw_avx2(auVar15,auVar31);
          auVar31 = vpsraw_avx2(auVar31,ZEXT416(uVar6));
          auVar18 = vpaddw_avx2(auVar15,auVar18);
          auVar18 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
          auVar18 = vpackuswb_avx2(auVar31,auVar18);
          auVar23 = vpermq_avx2(auVar23,0xd8);
          auVar18 = vpermq_avx2(auVar18,0xd8);
          *(undefined1 (*) [32])(puVar3 + -0x30) = auVar23;
          *(undefined1 (*) [32])(puVar3 + -0x10) = auVar18;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + lVar9 * 2);
          puVar3 = puVar3 + dst_stride0;
          pauVar7 = (undefined1 (*) [16])(*pauVar7 + src_stride);
          h = h + -1;
        } while (h != 0);
      }
      else {
        lVar2 = (long)src_stride;
        if (w == 0x20) {
          auVar15 = vpsubw_avx2(auVar18,auVar10);
          do {
            auVar18 = vpmovzxbw_avx2(*(undefined1 (*) [16])src);
            auVar23 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar2));
            auVar31 = vpmovzxbw_avx2(*(undefined1 (*) [16])((long)src + 0x10));
            auVar39 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                      (*(undefined1 (*) [16])((long)src + 0x10) + lVar2));
            auVar18 = vpsllw_avx2(auVar18,4);
            auVar23 = vpsllw_avx2(auVar23,4);
            auVar31 = vpsllw_avx2(auVar31,4);
            auVar39 = vpsllw_avx2(auVar39,4);
            auVar18 = vpaddw_avx2(auVar18,auVar10);
            auVar23 = vpaddw_avx2(auVar23,auVar10);
            auVar31 = vpaddw_avx2(auVar31,auVar10);
            auVar39 = vpaddw_avx2(auVar39,auVar10);
            auVar47 = vpunpcklwd_avx2(*pauVar8,auVar18);
            auVar41 = vpunpckhwd_avx2(*pauVar8,auVar18);
            auVar18 = vpmaddwd_avx2(auVar47,auVar13);
            auVar41 = vpmaddwd_avx2(auVar41,auVar13);
            auVar47 = vpsrad_avx2(auVar18,4);
            auVar18 = vpsrad_avx2(auVar41,4);
            auVar18 = vpackssdw_avx2(auVar47,auVar18);
            auVar47 = vpunpcklwd_avx2(*(undefined1 (*) [32])(*pauVar8 + lVar9 * 2),auVar23);
            auVar41 = vpunpckhwd_avx2(*(undefined1 (*) [32])(*pauVar8 + lVar9 * 2),auVar23);
            auVar23 = vpmaddwd_avx2(auVar47,auVar13);
            auVar41 = vpmaddwd_avx2(auVar41,auVar13);
            auVar47 = vpsrad_avx2(auVar23,4);
            auVar23 = vpsrad_avx2(auVar41,4);
            auVar23 = vpackssdw_avx2(auVar47,auVar23);
            auVar47 = vpunpcklwd_avx2(pauVar8[1],auVar31);
            auVar41 = vpunpckhwd_avx2(pauVar8[1],auVar31);
            auVar31 = vpmaddwd_avx2(auVar47,auVar13);
            auVar41 = vpmaddwd_avx2(auVar41,auVar13);
            auVar47 = vpsrad_avx2(auVar31,4);
            auVar31 = vpsrad_avx2(auVar41,4);
            auVar31 = vpackssdw_avx2(auVar47,auVar31);
            auVar47 = vpunpcklwd_avx2(*(undefined1 (*) [32])(*pauVar8 + (long)(iVar1 + 0x10) * 2),
                                      auVar39);
            auVar41 = vpunpckhwd_avx2(*(undefined1 (*) [32])(*pauVar8 + (long)(iVar1 + 0x10) * 2),
                                      auVar39);
            auVar39 = vpmaddwd_avx2(auVar47,auVar13);
            auVar41 = vpmaddwd_avx2(auVar41,auVar13);
            auVar18 = vpaddw_avx2(auVar15,auVar18);
            auVar47 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
            auVar44 = vpsrad_avx2(auVar39,4);
            auVar18 = vpaddw_avx2(auVar15,auVar23);
            auVar23 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
            auVar39 = vpsrad_avx2(auVar41,4);
            auVar18 = vpaddw_avx2(auVar15,auVar31);
            auVar31 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
            auVar18 = vpackssdw_avx2(auVar44,auVar39);
            auVar18 = vpaddw_avx2(auVar15,auVar18);
            auVar39 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
            auVar18 = vpackuswb_avx2(auVar47,auVar23);
            auVar23 = vpackuswb_avx2(auVar31,auVar39);
            auVar18 = vpermq_avx2(auVar18,0xd8);
            auVar23 = vpermq_avx2(auVar23,0xd8);
            *(undefined1 (*) [16])dst0 = auVar18._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst0 + dst_stride0) = auVar18._16_16_;
            *(undefined1 (*) [16])((long)dst0 + 0x10) = auVar23._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst0 + (dst_stride0 + 0x10)) =
                 auVar23._16_16_;
            src = *(undefined1 (*) [16])src + src_stride * 2;
            dst0 = *(undefined1 (*) [16])dst0 + dst_stride0 * 2;
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 2) * 2);
            h = h + -2;
          } while (h != 0);
        }
        else {
          auVar15 = vpsubw_avx2(auVar18,auVar10);
          do {
            auVar18 = vpmovzxbw_avx2(*(undefined1 (*) [16])src);
            auVar23 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar2));
            auVar31 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar2 * 2));
            auVar39 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                      (*(undefined1 (*) [16])src + src_stride * 3));
            auVar18 = vpsllw_avx2(auVar18,4);
            auVar23 = vpsllw_avx2(auVar23,4);
            auVar31 = vpsllw_avx2(auVar31,4);
            auVar39 = vpsllw_avx2(auVar39,4);
            auVar18 = vpaddw_avx2(auVar18,auVar10);
            auVar23 = vpaddw_avx2(auVar23,auVar10);
            auVar31 = vpaddw_avx2(auVar31,auVar10);
            auVar39 = vpaddw_avx2(auVar39,auVar10);
            auVar47 = vpunpcklwd_avx2(*pauVar8,auVar18);
            auVar41 = vpunpckhwd_avx2(*pauVar8,auVar18);
            auVar18 = vpmaddwd_avx2(auVar47,auVar13);
            auVar41 = vpmaddwd_avx2(auVar41,auVar13);
            auVar47 = vpsrad_avx2(auVar18,4);
            auVar18 = vpsrad_avx2(auVar41,4);
            auVar18 = vpackssdw_avx2(auVar47,auVar18);
            auVar47 = vpunpcklwd_avx2(*(undefined1 (*) [32])(*pauVar8 + lVar9 * 2),auVar23);
            auVar41 = vpunpckhwd_avx2(*(undefined1 (*) [32])(*pauVar8 + lVar9 * 2),auVar23);
            auVar23 = vpmaddwd_avx2(auVar47,auVar13);
            auVar41 = vpmaddwd_avx2(auVar41,auVar13);
            auVar47 = vpsrad_avx2(auVar23,4);
            auVar23 = vpsrad_avx2(auVar41,4);
            auVar23 = vpackssdw_avx2(auVar47,auVar23);
            auVar47 = vpunpcklwd_avx2(*(undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 2) * 2),
                                      auVar31);
            auVar41 = vpunpckhwd_avx2(*(undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 2) * 2),
                                      auVar31);
            auVar31 = vpmaddwd_avx2(auVar47,auVar13);
            auVar41 = vpmaddwd_avx2(auVar41,auVar13);
            auVar47 = vpsrad_avx2(auVar31,4);
            auVar31 = vpsrad_avx2(auVar41,4);
            auVar31 = vpackssdw_avx2(auVar47,auVar31);
            auVar47 = vpunpcklwd_avx2(*(undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 3) * 2),
                                      auVar39);
            auVar41 = vpunpckhwd_avx2(*(undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 3) * 2),
                                      auVar39);
            auVar39 = vpmaddwd_avx2(auVar47,auVar13);
            auVar41 = vpmaddwd_avx2(auVar41,auVar13);
            auVar18 = vpaddw_avx2(auVar15,auVar18);
            auVar47 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
            auVar44 = vpsrad_avx2(auVar39,4);
            auVar18 = vpaddw_avx2(auVar15,auVar23);
            auVar23 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
            auVar39 = vpsrad_avx2(auVar41,4);
            auVar18 = vpaddw_avx2(auVar15,auVar31);
            auVar31 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
            auVar18 = vpackssdw_avx2(auVar44,auVar39);
            auVar18 = vpaddw_avx2(auVar15,auVar18);
            auVar39 = vpsraw_avx2(auVar18,ZEXT416(uVar6));
            auVar18 = vpackuswb_avx2(auVar47,auVar23);
            auVar23 = vpackuswb_avx2(auVar31,auVar39);
            auVar18 = vpermq_avx2(auVar18,0xd8);
            auVar23 = vpermq_avx2(auVar23,0xd8);
            *(undefined1 (*) [16])dst0 = auVar18._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst0 + dst_stride0) = auVar18._16_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst0 + dst_stride0 * 2) = auVar23._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst0 + dst_stride0 * 3) = auVar23._16_16_;
            src = *(undefined1 (*) [16])src + (src_stride << 2);
            dst0 = *(undefined1 (*) [16])dst0 + (dst_stride0 << 2);
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + (long)(iVar1 * 4) * 2);
            h = h + -4;
          } while (h != 0);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_copy_avx2(const uint8_t *src, int src_stride,
                                        uint8_t *dst0, int dst_stride0, int w,
                                        int h, ConvolveParams *conv_params) {
  const int bd = 8;
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  assert(conv_params->round_0 == 3);
  assert(conv_params->round_1 == 7);
  assert(w % 4 == 0);
  assert(h % 4 == 0);

  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const __m256i wt = unpack_weights_avx2(conv_params);
  const __m256i zero = _mm256_setzero_si256();

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi16((1 << rounding_shift) >> 1);

  if (do_average) {
    if (use_dist_wtd_comp_avg) {
      DO_AVG_2D_COPY(1)
    } else {
      DO_AVG_2D_COPY(0)
    }
  } else {
    av1_dist_wtd_convolve_2d_no_avg_copy_avx2(src, src_stride, dst, dst_stride,
                                              w, h, offset_const);
  }
}